

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPack.c
# Opt level: O2

void Gia_ManLutPacking(Gia_Man_t *p,int nBlockSize,int DelayRoute,int DelayDir,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar8;
  ulong uVar9;
  Vec_Int_t *p_03;
  Vec_Int_t *p_04;
  int iVar10;
  int Addition;
  int Addition_00;
  int iVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  int Delays [32];
  int Perm [32];
  
  pVVar7 = Gia_ManLutCollect(p);
  p_00 = Vec_IntStart(p->nObjs);
  p_01 = Vec_IntStart(p->nObjs);
  iVar11 = pVVar7->nSize;
  p_02 = Vec_IntAlloc((iVar11 * 2) / nBlockSize);
  uVar17 = 0;
  iVar10 = 0;
  if (0 < iVar11) {
    iVar10 = iVar11;
  }
  for (iVar13 = 0; iVar13 != iVar10; iVar13 = iVar13 + 1) {
    iVar2 = Vec_IntEntry(pVVar7,iVar13);
    uVar3 = Gia_ObjLutSize(p,iVar2);
    if (0x20 < (int)uVar3) {
      __assert_fail("nSize <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0x8a,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    lVar18 = 0;
    while( true ) {
      iVar4 = Gia_ObjLutSize(p,iVar2);
      if (iVar4 <= lVar18) break;
      piVar8 = Gia_ObjLutFanins(p,iVar2);
      iVar4 = piVar8[lVar18];
      iVar5 = Vec_IntEntry(p_00,iVar4);
      Delays[lVar18] = iVar5;
      Perm[lVar18] = iVar4;
      lVar18 = lVar18 + 1;
    }
    uVar9 = 1;
    if (1 < (int)uVar3) {
      uVar9 = (ulong)uVar3;
    }
    uVar12 = 1;
    for (uVar14 = 0; iVar4 = Delays[0], uVar14 != (int)uVar9 - 1; uVar14 = uVar14 + 1) {
      uVar16 = uVar14 & 0xffffffff;
      for (uVar15 = uVar12; iVar4 = (int)uVar16, uVar3 != uVar15; uVar15 = uVar15 + 1) {
        uVar1 = uVar15 & 0xffffffff;
        if (Delays[uVar15] <= Delays[iVar4]) {
          uVar1 = uVar16;
        }
        uVar16 = uVar1;
      }
      iVar5 = Perm[uVar14];
      Perm[uVar14] = Perm[iVar4];
      iVar6 = Delays[uVar14];
      Delays[uVar14] = Delays[iVar4];
      Perm[iVar4] = iVar5;
      Delays[iVar4] = iVar6;
      uVar12 = uVar12 + 1;
    }
    if ((1 < (int)uVar3) && (Delays[0] < Delays[uVar3 - 1])) {
      __assert_fail("nSize < 2 || Delays[0] >= Delays[nSize-1]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0x91,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    if ((Delays[0] < 0) || (Delays[(long)(int)uVar3 + -1] < 0)) {
      __assert_fail("Delays[0] >= 0 && Delays[nSize-1] >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0x92,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    iVar5 = Vec_IntEntry(p_01,Perm[0]);
    if ((iVar4 == 0) || (iVar4 <= Delays[1])) {
LAB_0060f1ba:
      Vec_IntWriteEntry(p_01,iVar2,p_02->nSize);
      Vec_IntPush(p_02,1);
      iVar5 = DelayRoute;
    }
    else {
      iVar6 = Vec_IntEntry(p_02,iVar5);
      if (nBlockSize <= iVar6) goto LAB_0060f1ba;
      Vec_IntWriteEntry(p_01,iVar2,iVar5);
      Vec_IntAddToEntry(p_02,iVar5,Addition);
      iVar5 = DelayDir;
    }
    uVar3 = iVar5 + iVar4;
    for (uVar12 = 1; uVar9 != uVar12; uVar12 = uVar12 + 1) {
      if ((int)uVar3 <= Delays[uVar12] + DelayRoute) {
        uVar3 = Delays[uVar12] + DelayRoute;
      }
    }
    Vec_IntWriteEntry(p_00,iVar2,uVar3);
    if ((int)uVar17 <= (int)uVar3) {
      uVar17 = (ulong)uVar3;
    }
  }
  uVar3 = p_02->nSize;
  uVar9 = 0;
  uVar12 = 0;
  if (0 < (int)uVar3) {
    uVar12 = (ulong)uVar3;
  }
  iVar10 = 0;
  for (; uVar12 != uVar9; uVar9 = uVar9 + 1) {
    iVar10 = iVar10 + p_02->pArray[uVar9];
  }
  if (iVar10 != iVar11) {
    __assert_fail("Vec_IntSum(vBSize) == Vec_IntSize(vOrder)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xa7,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  p_03 = Vec_IntAlloc(iVar11 + uVar3 + 1);
  Vec_IntPush(p_03,uVar3);
  p_04 = Vec_IntAlloc(uVar3);
  for (iVar10 = 0; iVar10 != (int)uVar12; iVar10 = iVar10 + 1) {
    iVar2 = Vec_IntEntry(p_02,iVar10);
    Vec_IntPush(p_03,iVar2);
    iVar13 = p_03->nSize;
    Vec_IntPush(p_04,iVar13);
    if (0 < iVar2) {
      iVar2 = iVar2 + iVar13;
      iVar4 = p_03->nCap * 2;
      iVar5 = iVar2;
      if ((iVar4 < iVar2) || (iVar5 = iVar4, p_03->nCap < iVar2)) {
        Vec_IntGrow(p_03,iVar5);
        iVar13 = p_03->nSize;
      }
      for (lVar18 = (long)iVar13; lVar18 < iVar2; lVar18 = lVar18 + 1) {
        p_03->pArray[lVar18] = -1;
      }
      p_03->nSize = iVar2;
    }
  }
  if ((p_03->nCap != 0x10) && (p_03->nSize != p_03->nCap)) {
    __assert_fail("Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xb3,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  while (0 < iVar11) {
    iVar11 = iVar11 + -1;
    iVar10 = Vec_IntEntry(pVVar7,iVar11);
    iVar13 = Vec_IntEntry(p_01,iVar10);
    iVar2 = Vec_IntEntry(p_04,iVar13);
    iVar4 = Vec_IntEntry(p_03,iVar2);
    if (iVar4 != -1) {
      __assert_fail("Vec_IntEntry(vPacking, Start) == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                    ,0xb9,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
    }
    Vec_IntWriteEntry(p_03,iVar2,iVar10);
    Vec_IntAddToEntry(p_04,iVar13,Addition_00);
  }
  uVar12 = 0;
  uVar9 = (ulong)(uint)p_03->nSize;
  if (p_03->nSize < 1) {
    uVar9 = uVar12;
  }
  iVar11 = 0;
  for (; uVar9 != uVar12; uVar12 = uVar12 + 1) {
    iVar11 = iVar11 + (uint)(p_03->pArray[uVar12] == -1);
  }
  if (iVar11 != 0) {
    __assert_fail("Vec_IntCountEntry(vPacking, -1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaPack.c"
                  ,0xbd,"void Gia_ManLutPacking(Gia_Man_t *, int, int, int, int)");
  }
  Vec_IntFree(pVVar7);
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_04);
  pVVar7 = p->vPacking;
  if (pVVar7 != (Vec_Int_t *)0x0) {
    if (pVVar7->pArray != (int *)0x0) {
      free(pVVar7->pArray);
      p->vPacking->pArray = (int *)0x0;
      pVVar7 = p->vPacking;
      if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_0060f43a;
    }
    free(pVVar7);
  }
LAB_0060f43a:
  p->vPacking = p_03;
  printf("Global delay = %d.\n",uVar17);
  return;
}

Assistant:

void Gia_ManLutPacking( Gia_Man_t * p, int nBlockSize, int DelayRoute, int DelayDir, int fVerbose )
{
    int Delays[32], Perm[32];
    Vec_Int_t * vPacking, * vStarts;
    Vec_Int_t * vOrder = Gia_ManLutCollect( p );
    Vec_Int_t * vDelay = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBlock = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vBSize = Vec_IntAlloc( 2 * Vec_IntSize(vOrder) / nBlockSize );
    int i, k, Id, iFan, nSize, iBlock, Delay, DelayMax = 0;
    // create blocks
    Vec_IntForEachEntry( vOrder, Id, i )
    {
        nSize = Gia_ObjLutSize( p, Id );
        assert( nSize <= 32 );
        Gia_LutForEachFanin( p, Id, iFan, k )
        {
            Delays[k] = Vec_IntEntry(vDelay, iFan);
            Perm[k] = iFan;
        }
        Vec_IntSelectSortCost2Reverse( Perm, nSize, Delays );
        assert( nSize < 2 || Delays[0] >= Delays[nSize-1] );
        assert( Delays[0] >= 0 && Delays[nSize-1] >= 0 );
        // check if we can reduce delay by adding it to the same bin as the latest one
        iBlock = Vec_IntEntry( vBlock, Perm[0] );
        if ( Delays[0] > 0 && Delays[0] > Delays[1] && Vec_IntEntry(vBSize, iBlock) < nBlockSize )
        {
            Delay = Delays[0] + DelayDir;
            Vec_IntWriteEntry( vBlock, Id, iBlock );
            Vec_IntAddToEntry( vBSize, iBlock, 1 );
        }
        else // clean new block
        {
            Delay = Delays[0] + DelayRoute;
            Vec_IntWriteEntry( vBlock, Id, Vec_IntSize(vBSize) );
            Vec_IntPush( vBSize, 1 );
        }
        // calculate delay
        for ( k = 1; k < nSize; k++ )
            Delay = Abc_MaxInt( Delay, Delays[k] + DelayRoute );
        Vec_IntWriteEntry( vDelay, Id, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    assert( Vec_IntSum(vBSize) == Vec_IntSize(vOrder) );
    // create packing info
    vPacking = Vec_IntAlloc( Vec_IntSize(vBSize) + Vec_IntSize(vOrder) + 1 );
    Vec_IntPush( vPacking, Vec_IntSize(vBSize) );
    // create starting places for each block
    vStarts = Vec_IntAlloc( Vec_IntSize(vBSize) );
    Vec_IntForEachEntry( vBSize, nSize, i )
    {
        Vec_IntPush( vPacking, nSize );
        Vec_IntPush( vStarts, Vec_IntSize(vPacking) );
        Vec_IntFillExtra( vPacking, Vec_IntSize(vPacking) + nSize, -1 );
    }
    assert( Vec_IntCap(vPacking) == 16 || Vec_IntSize(vPacking) == Vec_IntCap(vPacking) );
    // collect LUTs from the block
    Vec_IntForEachEntryReverse( vOrder, Id, i )
    {
        int Block = Vec_IntEntry( vBlock, Id );
        int Start = Vec_IntEntry( vStarts, Block );
        assert( Vec_IntEntry(vPacking, Start) == -1 );
        Vec_IntWriteEntry( vPacking, Start, Id );
        Vec_IntAddToEntry( vStarts, Block, 1 );
    }
    assert( Vec_IntCountEntry(vPacking, -1) == 0 );
    // cleanup
    Vec_IntFree( vOrder );
    Vec_IntFree( vDelay );
    Vec_IntFree( vBlock );
    Vec_IntFree( vBSize );
    Vec_IntFree( vStarts );
    Vec_IntFreeP( &p->vPacking );
    p->vPacking = vPacking;
    printf( "Global delay = %d.\n", DelayMax );
}